

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O1

Player * __thiscall Gameplay::checkWinningCondition(Gameplay *this)

{
  Gameplay *pGVar1;
  int iVar2;
  Stronghold *this_00;
  string *psVar3;
  ostream *poVar4;
  Player *pPVar5;
  
  pGVar1 = (Gameplay *)
           (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
           super__List_node_base._M_next;
  (this->it)._M_node = (_List_node_base *)pGVar1;
  while (pGVar1 != this) {
    iVar2 = Player::getNumberOfProvinces
                      ((Player *)
                       &(pGVar1->players).super__List_base<Player,_std::allocator<Player>_>._M_impl.
                        _M_node._M_size);
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
      this_00 = Player::getStronghold((Player *)((this->it)._M_node + 1));
      psVar3 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"lost.",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__cxx11::list<Player,_std::allocator<Player>_>::remove
                (&this->players,(char *)((this->it)._M_node + 1));
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"players remaining.",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      (this->it)._M_node =
           (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
           super__List_node_base._M_next;
    }
    pGVar1 = (Gameplay *)((this->it)._M_node)->_M_next;
    (this->it)._M_node = (_List_node_base *)pGVar1;
  }
  pPVar5 = (Player *)0x0;
  if ((this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node._M_size == 1
     ) {
    pPVar5 = (Player *)
             ((this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
              super__List_node_base._M_next + 1);
  }
  return pPVar5;
}

Assistant:

Player *Gameplay::checkWinningCondition()                       //if someone won returns a pointer to that player else returns null
{                                                               //prints if someone lost and removes him from the list
    for (it=players.begin(); it!=players.end(); it++)
    {
        if (!it->getNumberOfProvinces())
        {
            cout << "Player "<<it->getStronghold()->getName()<<"lost." << endl;

            players.remove(*it);
            cout << players.size() <<"players remaining." << endl;

            it=players.begin();
        }
    }
    if (players.size() == 1)
        return &*players.begin();

    return nullptr;
}